

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

uchar * extra_get_record(isoent *isoent,int *space,int *off,int *loc)

{
  isoent *piVar1;
  extr_rec **ppeVar2;
  extr_rec *peVar3;
  uint uVar4;
  uint uVar5;
  
  piVar1 = isoent->parent;
  if (off == (int *)0x0) {
    if (((piVar1->extr_rec_list).first == (extr_rec *)0x0) ||
       (ppeVar2 = (piVar1->extr_rec_list).last, 0x7e4 < *(int *)((long)ppeVar2 + -0x804))) {
      peVar3 = (extr_rec *)malloc(0x810);
      if (peVar3 == (extr_rec *)0x0) {
        return (uchar *)0x0;
      }
      peVar3->location = 0;
      peVar3->offset = 0;
      peVar3->next = (extr_rec *)0x0;
      *(piVar1->extr_rec_list).last = peVar3;
      (piVar1->extr_rec_list).last = &peVar3->next;
    }
    else {
      peVar3 = (extr_rec *)(ppeVar2 + -0x101);
    }
  }
  else {
    peVar3 = (piVar1->extr_rec_list).current;
    if (0x7e4 < peVar3->offset) {
      peVar3 = peVar3->next;
    }
  }
  uVar4 = 0x7e4 - peVar3->offset;
  uVar5 = 0x7e3 - peVar3->offset;
  if ((uVar4 & 1) == 0) {
    uVar5 = uVar4;
  }
  *space = uVar5;
  if (off != (int *)0x0) {
    *off = peVar3->offset;
  }
  if (loc != (int *)0x0) {
    *loc = peVar3->location;
  }
  (piVar1->extr_rec_list).current = peVar3;
  return peVar3->buf + peVar3->offset;
}

Assistant:

static unsigned char *
extra_get_record(struct isoent *isoent, int *space, int *off, int *loc)
{
	struct extr_rec *rec;

	isoent = isoent->parent;
	if (off != NULL) {
		/* Storing data into an extra record. */
		rec = isoent->extr_rec_list.current;
		if (DR_SAFETY > LOGICAL_BLOCK_SIZE - rec->offset)
			rec = rec->next;
	} else {
		/* Calculating the size of an extra record. */
		rec = extra_last_record(isoent);
		if (rec == NULL ||
		    DR_SAFETY > LOGICAL_BLOCK_SIZE - rec->offset) {
			rec = malloc(sizeof(*rec));
			if (rec == NULL)
				return (NULL);
			rec->location = 0;
			rec->offset = 0;
			/* Insert `rec` into the tail of isoent->extr_rec_list */
			rec->next = NULL;
			*isoent->extr_rec_list.last = rec;
			isoent->extr_rec_list.last = &(rec->next);
		}
	}
	*space = LOGICAL_BLOCK_SIZE - rec->offset - DR_SAFETY;
	if (*space & 0x01)
		*space -= 1;/* Keep padding space. */
	if (off != NULL)
		*off = rec->offset;
	if (loc != NULL)
		*loc = rec->location;
	isoent->extr_rec_list.current = rec;

	return (&rec->buf[rec->offset]);
}